

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_ptr.h
# Opt level: O0

second_type *
ctemplate::
find_ptr<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,unsigned_long>
          (small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
           *c,unsigned_long v)

{
  bool bVar1;
  value_type *pvVar2;
  second_type *local_40;
  const_iterator local_38;
  undefined1 local_28 [8];
  const_iterator i;
  unsigned_long v_local;
  small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *c_local;
  
  i.hash_iter_._M_node = (_Base_ptr)v;
  _local_28 = small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
              ::find(c,(key_type *)&i.hash_iter_);
  local_38 = small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
             ::end(c);
  bVar1 = small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
          ::const_iterator::operator==((const_iterator *)local_28,&local_38);
  if (bVar1) {
    local_40 = (second_type *)0x0;
  }
  else {
    pvVar2 = small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
             ::const_iterator::operator->((const_iterator *)local_28);
    local_40 = &pvVar2->second;
  }
  return local_40;
}

Assistant:

const typename T::value_type::second_type* find_ptr(const T& c, U v)
{
  typename T::const_iterator i = c.find(v);
  return i == c.end() ? NULL : &i->second;
}